

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O1

RowGroupWriteData * __thiscall
duckdb::RowGroup::WriteToDisk
          (RowGroupWriteData *__return_storage_ptr__,RowGroup *this,RowGroupWriter *writer)

{
  PartialBlockManager *pPVar1;
  RowGroupWriteData *pRVar2;
  CompressionType CVar3;
  ColumnData *pCVar4;
  InternalException *this_00;
  storage_t c;
  vector<duckdb::CompressionType,_true> compression_types;
  RowGroupWriteInfo info;
  vector<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_> local_78;
  RowGroupWriteData *local_58;
  undefined1 local_50 [32];
  
  local_78.super__Vector_base<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (CompressionType *)0x0;
  local_78.super__Vector_base<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (CompressionType *)0x0;
  local_58 = __return_storage_ptr__;
  ::std::vector<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>::reserve
            (&local_78,
             (long)(this->columns).
                   super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                   .
                   super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->columns).
                   super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                   .
                   super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  if ((this->columns).
      super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
      .
      super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->columns).
      super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
      .
      super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    c = 0;
    do {
      pCVar4 = GetColumn(this,c);
      if ((pCVar4->count).super___atomic_base<unsigned_long>._M_i !=
          (this->super_SegmentBase<duckdb::RowGroup>).count.super___atomic_base<unsigned_long>._M_i)
      {
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        local_50._0_8_ = local_50 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,
                   "Corrupted in-memory column - column with index %llu has misaligned count (row group has %llu rows, column has %llu)"
                   ,"");
        InternalException::InternalException<unsigned_long,unsigned_long,unsigned_long>
                  (this_00,(string *)local_50,c,
                   (this->super_SegmentBase<duckdb::RowGroup>).count.
                   super___atomic_base<unsigned_long>._M_i,
                   (pCVar4->count).super___atomic_base<unsigned_long>._M_i);
        __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      CVar3 = RowGroupWriter::GetColumnCompressionType(writer,c);
      local_50[0] = CVar3;
      if (local_78.
          super__Vector_base<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_78.
          super__Vector_base<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>::
        _M_realloc_insert<duckdb::CompressionType>
                  (&local_78,
                   (iterator)
                   local_78.
                   super__Vector_base<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>
                   ._M_impl.super__Vector_impl_data._M_finish,local_50);
      }
      else {
        *local_78.
         super__Vector_base<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>.
         _M_impl.super__Vector_impl_data._M_finish = CVar3;
        local_78.
        super__Vector_base<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_78.
             super__Vector_base<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      c = c + 1;
    } while (c < (ulong)((long)(this->columns).
                               super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                               .
                               super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->columns).
                               super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                               .
                               super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  pPVar1 = writer->partial_block_manager;
  local_50._16_4_ = (*writer->_vptr_RowGroupWriter[2])(writer);
  pRVar2 = local_58;
  local_50._0_8_ = pPVar1;
  local_50._8_8_ = &local_78;
  WriteToDisk(local_58,this,(RowGroupWriteInfo *)local_50);
  if (local_78.super__Vector_base<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return pRVar2;
}

Assistant:

RowGroupWriteData RowGroup::WriteToDisk(RowGroupWriter &writer) {
	vector<CompressionType> compression_types;
	compression_types.reserve(columns.size());
	for (idx_t column_idx = 0; column_idx < GetColumnCount(); column_idx++) {
		auto &column = GetColumn(column_idx);
		if (column.count != this->count) {
			throw InternalException("Corrupted in-memory column - column with index %llu has misaligned count (row "
			                        "group has %llu rows, column has %llu)",
			                        column_idx, this->count.load(), column.count.load());
		}
		compression_types.push_back(writer.GetColumnCompressionType(column_idx));
	}

	RowGroupWriteInfo info(writer.GetPartialBlockManager(), compression_types, writer.GetCheckpointType());
	return WriteToDisk(info);
}